

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O1

void __thiscall
wallmon::update_stats(wallmon *this,vector<int,_std::allocator<int>_> *pids,string read_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pid_t *ppVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  pair<int,_unsigned_long_long> pVar5;
  float uptime_sec;
  ifstream proc_uptime;
  string local_250;
  string local_230;
  byte abStack_210 [488];
  
  if ((this->got_mother_starttime == false) &&
     (ppVar2 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
     (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     != ppVar2)) {
    pVar5 = get_mother_starttime(this,*ppVar2);
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    if (pVar5.first == 0) {
      this->got_mother_starttime = true;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"wtime","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
               ::at(&this->walltime_stats,&local_230);
      uVar3 = sysconf(2);
      prmon::monitored_value::set_offset(pmVar4,pVar5.second / uVar3);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Error while reading mother starttime","");
      MessageBase::warning(&this->super_MessageBase,&local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if (pVar5.first != 0) {
      return;
    }
  }
  std::ifstream::ifstream(&local_230,"/proc/uptime",_S_in);
  std::istream::_M_extract<float>((float *)&local_230);
  if ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 5) == 0) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"wtime","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::at(&this->walltime_stats,&local_250);
    prmon::monitored_value::set_value(pmVar4,0);
  }
  else {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Error while reading /proc/uptime","");
    MessageBase::warning(&this->super_MessageBase,&local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(&local_230);
  return;
}

Assistant:

void wallmon::update_stats(const std::vector<pid_t>& pids,
                           const std::string read_path) {
  if (!got_mother_starttime && pids.size() > 0) {
    auto code_and_time = get_mother_starttime(pids[0]);
    if (code_and_time.first) {
      warning("Error while reading mother starttime");
      return;
    } else {
      got_mother_starttime = true;
      walltime_stats.at("wtime").set_offset(code_and_time.second /
                                            sysconf(_SC_CLK_TCK));
    }
  }

  std::ifstream proc_uptime{"/proc/uptime"};
  float uptime_sec{};
  proc_uptime >> uptime_sec;
  if (!proc_uptime) {
    warning("Error while reading /proc/uptime");
    return;
  }

  walltime_stats.at("wtime").set_value(uptime_sec);
}